

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

void __thiscall
gl4cts::EnhancedLayouts::XFBTooSmallStrideTest::testInit(XFBTooSmallStrideTest *this)

{
  value_type local_20;
  testCase test_case;
  GLuint stage;
  GLuint c;
  XFBTooSmallStrideTest *this_local;
  
  for (test_case.m_stage = COMPUTE; test_case.m_stage < GEOMETRY;
      test_case.m_stage = test_case.m_stage + VERTEX) {
    for (test_case.m_case = OFFSET; test_case.m_case < (CASE_MAX|BLOCK);
        test_case.m_case = test_case.m_case + STRIDE) {
      if (((test_case.m_case != OFFSET) && (test_case.m_case != BLOCK)) &&
         (test_case.m_case != (CASE_MAX|STRIDE))) {
        local_20.m_case = test_case.m_stage;
        local_20.m_stage = test_case.m_case;
        std::
        vector<gl4cts::EnhancedLayouts::XFBTooSmallStrideTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::XFBTooSmallStrideTest::testCase>_>
        ::push_back(&this->m_test_cases,&local_20);
      }
    }
  }
  return;
}

Assistant:

void XFBTooSmallStrideTest::testInit()
{
	for (GLuint c = 0; c < CASE_MAX; ++c)
	{
		for (GLuint stage = 0; stage < Utils::Shader::STAGE_MAX; ++stage)
		{
			/*
			 It is invalid to define transform feedback output in TCS, according to spec:
			 The data captured in transform feedback mode depends on the active programs on each of the shader stages.
			 If a program is active for the geometry shader stage, transform feedback captures the vertices of each
			 primitive emitted by the geometry shader. Otherwise, if a program is active for the tessellation evaluation
			 shader stage, transform feedback captures each primitive produced by the tessellation primitive generator,
			 whose vertices are processed by the tessellation evaluation shader. Otherwise, transform feedback captures
			 each primitive processed by the vertex shader.
			 */
			if ((Utils::Shader::COMPUTE == stage) || (Utils::Shader::TESS_CTRL == stage) ||
				(Utils::Shader::FRAGMENT == stage))
			{
				continue;
			}

			testCase test_case = { (CASES)c, (Utils::Shader::STAGES)stage };

			m_test_cases.push_back(test_case);
		}
	}
}